

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void init_best_pickmode(BEST_PICKMODE *bp)

{
  int_interpfilters iVar1;
  undefined8 *in_RDI;
  
  in_RDI[0xf] = 0x7fffffffffffffff;
  *(undefined1 *)(in_RDI + 1) = 0xd;
  *(undefined1 *)((long)in_RDI + 0xb) = 1;
  *(undefined1 *)((long)in_RDI + 0xc) = 0xff;
  *(undefined1 *)((long)in_RDI + 9) = 1;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  iVar1 = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
  *(int_interpfilters *)(in_RDI + 2) = iVar1;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0xe) = 0;
  *in_RDI = 0;
  *(undefined1 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  memset(in_RDI + 3,0,0x24);
  memset(in_RDI + 8,0,0x32);
  return;
}

Assistant:

static inline void init_best_pickmode(BEST_PICKMODE *bp) {
  bp->best_sse = INT64_MAX;
  bp->best_mode = NEARESTMV;
  bp->best_ref_frame = LAST_FRAME;
  bp->best_second_ref_frame = NONE_FRAME;
  bp->best_tx_size = TX_8X8;
  bp->tx_type = DCT_DCT;
  bp->best_pred_filter = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
  bp->best_mode_skip_txfm = 0;
  bp->best_mode_initial_skip_flag = 0;
  bp->best_pred = NULL;
  bp->best_motion_mode = SIMPLE_TRANSLATION;
  bp->num_proj_ref = 0;
  av1_zero(bp->wm_params);
  av1_zero(bp->pmi);
}